

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_multiply(matrix4 *self,matrix4 *mT)

{
  undefined1 local_58 [8];
  matrix4 r;
  matrix4 *mT_local;
  matrix4 *self_local;
  
  r.field_0._56_8_ = mT;
  matrix4_identity((matrix4 *)local_58);
  local_58._0_4_ =
       (self->field_0).m[0xc] * *(float *)(r.field_0._56_8_ + 0xc) +
       (self->field_0).m[8] * *(float *)(r.field_0._56_8_ + 8) +
       (self->field_0).m[0] * *(float *)r.field_0._56_8_ +
       (self->field_0).m[4] * *(float *)(r.field_0._56_8_ + 4);
  local_58._4_4_ =
       (self->field_0).m[0xd] * *(float *)(r.field_0._56_8_ + 0xc) +
       (self->field_0).m[9] * *(float *)(r.field_0._56_8_ + 8) +
       (self->field_0).m[1] * *(float *)r.field_0._56_8_ +
       (self->field_0).m[5] * *(float *)(r.field_0._56_8_ + 4);
  r.field_0.m[0] =
       (self->field_0).m[0xe] * *(float *)(r.field_0._56_8_ + 0xc) +
       (self->field_0).m[10] * *(float *)(r.field_0._56_8_ + 8) +
       (self->field_0).m[2] * *(float *)r.field_0._56_8_ +
       (self->field_0).m[6] * *(float *)(r.field_0._56_8_ + 4);
  r.field_0.m[1] =
       (self->field_0).m[0xf] * *(float *)(r.field_0._56_8_ + 0xc) +
       (self->field_0).m[0xb] * *(float *)(r.field_0._56_8_ + 8) +
       (self->field_0).m[3] * *(float *)r.field_0._56_8_ +
       (self->field_0).m[7] * *(float *)(r.field_0._56_8_ + 4);
  r.field_0.m[2] =
       (self->field_0).m[0xc] * *(float *)(r.field_0._56_8_ + 0x1c) +
       (self->field_0).m[8] * *(float *)(r.field_0._56_8_ + 0x18) +
       (self->field_0).m[0] * *(float *)(r.field_0._56_8_ + 0x10) +
       (self->field_0).m[4] * *(float *)(r.field_0._56_8_ + 0x14);
  r.field_0.m[3] =
       (self->field_0).m[0xd] * *(float *)(r.field_0._56_8_ + 0x1c) +
       (self->field_0).m[9] * *(float *)(r.field_0._56_8_ + 0x18) +
       (self->field_0).m[1] * *(float *)(r.field_0._56_8_ + 0x10) +
       (self->field_0).m[5] * *(float *)(r.field_0._56_8_ + 0x14);
  r.field_0.m[4] =
       (self->field_0).m[0xe] * *(float *)(r.field_0._56_8_ + 0x1c) +
       (self->field_0).m[10] * *(float *)(r.field_0._56_8_ + 0x18) +
       (self->field_0).m[2] * *(float *)(r.field_0._56_8_ + 0x10) +
       (self->field_0).m[6] * *(float *)(r.field_0._56_8_ + 0x14);
  r.field_0.m[5] =
       (self->field_0).m[0xf] * *(float *)(r.field_0._56_8_ + 0x1c) +
       (self->field_0).m[0xb] * *(float *)(r.field_0._56_8_ + 0x18) +
       (self->field_0).m[3] * *(float *)(r.field_0._56_8_ + 0x10) +
       (self->field_0).m[7] * *(float *)(r.field_0._56_8_ + 0x14);
  r.field_0.m[6] =
       (self->field_0).m[0xc] * *(float *)(r.field_0._56_8_ + 0x2c) +
       (self->field_0).m[8] * *(float *)(r.field_0._56_8_ + 0x28) +
       (self->field_0).m[0] * *(float *)(r.field_0._56_8_ + 0x20) +
       (self->field_0).m[4] * *(float *)(r.field_0._56_8_ + 0x24);
  r.field_0.m[7] =
       (self->field_0).m[0xd] * *(float *)(r.field_0._56_8_ + 0x2c) +
       (self->field_0).m[9] * *(float *)(r.field_0._56_8_ + 0x28) +
       (self->field_0).m[1] * *(float *)(r.field_0._56_8_ + 0x20) +
       (self->field_0).m[5] * *(float *)(r.field_0._56_8_ + 0x24);
  r.field_0.m[8] =
       (self->field_0).m[0xe] * *(float *)(r.field_0._56_8_ + 0x2c) +
       (self->field_0).m[10] * *(float *)(r.field_0._56_8_ + 0x28) +
       (self->field_0).m[2] * *(float *)(r.field_0._56_8_ + 0x20) +
       (self->field_0).m[6] * *(float *)(r.field_0._56_8_ + 0x24);
  r.field_0.m[9] =
       (self->field_0).m[0xf] * *(float *)(r.field_0._56_8_ + 0x2c) +
       (self->field_0).m[0xb] * *(float *)(r.field_0._56_8_ + 0x28) +
       (self->field_0).m[3] * *(float *)(r.field_0._56_8_ + 0x20) +
       (self->field_0).m[7] * *(float *)(r.field_0._56_8_ + 0x24);
  r.field_0.m[10] =
       (self->field_0).m[0xc] * *(float *)(r.field_0._56_8_ + 0x3c) +
       (self->field_0).m[8] * *(float *)(r.field_0._56_8_ + 0x38) +
       (self->field_0).m[0] * *(float *)(r.field_0._56_8_ + 0x30) +
       (self->field_0).m[4] * *(float *)(r.field_0._56_8_ + 0x34);
  r.field_0.m[0xb] =
       (self->field_0).m[0xd] * *(float *)(r.field_0._56_8_ + 0x3c) +
       (self->field_0).m[9] * *(float *)(r.field_0._56_8_ + 0x38) +
       (self->field_0).m[1] * *(float *)(r.field_0._56_8_ + 0x30) +
       (self->field_0).m[5] * *(float *)(r.field_0._56_8_ + 0x34);
  r.field_0.m[0xc] =
       (self->field_0).m[0xe] * *(float *)(r.field_0._56_8_ + 0x3c) +
       (self->field_0).m[10] * *(float *)(r.field_0._56_8_ + 0x38) +
       (self->field_0).m[2] * *(float *)(r.field_0._56_8_ + 0x30) +
       (self->field_0).m[6] * *(float *)(r.field_0._56_8_ + 0x34);
  r.field_0.m[0xd] =
       (self->field_0).m[0xf] * *(float *)(r.field_0._56_8_ + 0x3c) +
       (self->field_0).m[0xb] * *(float *)(r.field_0._56_8_ + 0x38) +
       (self->field_0).m[3] * *(float *)(r.field_0._56_8_ + 0x30) +
       (self->field_0).m[7] * *(float *)(r.field_0._56_8_ + 0x34);
  matrix4_set(self,(matrix4 *)local_58);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_multiply(struct matrix4 *self, const struct matrix4 *mT)
{
	/* mT is the multiplicand */

	struct matrix4 r;

	matrix4_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10 + self->c02 * mT->c20 + self->c03 * mT->c30;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10 + self->c12 * mT->c20 + self->c13 * mT->c30;
	r.r02 = self->c20 * mT->c00 + self->c21 * mT->c10 + self->c22 * mT->c20 + self->c23 * mT->c30;
	r.r03 = self->c30 * mT->c00 + self->c31 * mT->c10 + self->c32 * mT->c20 + self->c33 * mT->c30;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11 + self->c02 * mT->c21 + self->c03 * mT->c31;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11 + self->c12 * mT->c21 + self->c13 * mT->c31;
	r.r12 = self->c20 * mT->c01 + self->c21 * mT->c11 + self->c22 * mT->c21 + self->c23 * mT->c31;
	r.r13 = self->c30 * mT->c01 + self->c31 * mT->c11 + self->c32 * mT->c21 + self->c33 * mT->c31;

	/* third row */
	r.r20 = self->c00 * mT->c02 + self->c01 * mT->c12 + self->c02 * mT->c22 + self->c03 * mT->c32;
	r.r21 = self->c10 * mT->c02 + self->c11 * mT->c12 + self->c12 * mT->c22 + self->c13 * mT->c32;
	r.r22 = self->c20 * mT->c02 + self->c21 * mT->c12 + self->c22 * mT->c22 + self->c23 * mT->c32;
	r.r23 = self->c30 * mT->c02 + self->c31 * mT->c12 + self->c32 * mT->c22 + self->c33 * mT->c32;

	/* fourth row */
	r.r30 = self->c00 * mT->c03 + self->c01 * mT->c13 + self->c02 * mT->c23 + self->c03 * mT->c33;
	r.r31 = self->c10 * mT->c03 + self->c11 * mT->c13 + self->c12 * mT->c23 + self->c13 * mT->c33;
	r.r32 = self->c20 * mT->c03 + self->c21 * mT->c13 + self->c22 * mT->c23 + self->c23 * mT->c33;
	r.r33 = self->c30 * mT->c03 + self->c31 * mT->c13 + self->c32 * mT->c23 + self->c33 * mT->c33;

	matrix4_set(self, &r); /* overwrite/save it */

	return self;
}